

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansi_code.c
# Opt level: O0

char * mpt_ansi_code(uint8_t type)

{
  char *pcStack_10;
  uint8_t type_local;
  
  if ((type & 0x20) == 0) {
    if (type == '\0') {
      pcStack_10 = "\x1b[1m";
    }
    else if (type < 0x10) {
      if (type < 8) {
        if (type < 4) {
          if (type < 3) {
            pcStack_10 = "\x1b[31m";
          }
          else {
            pcStack_10 = "\x1b[35m";
          }
        }
        else {
          pcStack_10 = "\x1b[33m";
        }
      }
      else {
        pcStack_10 = "\x1b[34m";
      }
    }
    else {
      pcStack_10 = "\x1b[32m";
    }
  }
  else {
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

extern const char *mpt_ansi_code(uint8_t type)
{
	if (type & MPT_LOG(File)) {
		return 0;
	}
	if (!type) return "\033[1m";
	if (type >= MPT_LOG(Debug))    return "\033[32m";
	if (type >= MPT_LOG(Info))     return "\033[34m";
	if (type >= MPT_LOG(Warning))  return "\033[33m";
	if (type >= MPT_LOG(Error))    return "\033[35m";
	return "\033[31m";
}